

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composable.cpp
# Opt level: O0

int main(void)

{
  anon_enum_32 aVar1;
  int local_54;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  undefined1 local_48 [8];
  Coro coroutine;
  
  coroutine.super_EboIndex<5UL>.index._4_4_ = 0;
  SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>::SCoro
            ((SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag> *)
             local_48,"composable");
  do {
    while (aVar1 = SCoro::
                   SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>
                   ::Poll((SCoro<PrintStart,_Delay<100U>::type,_PrintPollAttempts,_Delay<100U>::type,_PrintTag>
                           *)local_48), aVar1 != End) {
      putchar(0x2d);
      local_54 = 10;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_50,&local_54);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_50);
    }
    SCoro::SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag>::
    Reset<char_const(&)[11]>
              ((SCoro<PrintStart,Delay<100u>::type,PrintPollAttempts,Delay<100u>::type,PrintTag> *)
               local_48,(char (*) [11])"composable");
    printf("\n");
  } while( true );
}

Assistant:

int main()
{
    Coro coroutine{"composable"};
    while (true)
    {
        while ( coroutine.Poll() != SCoro::Result::End )
        {
            std::putchar('-');
            std::this_thread::sleep_for(std::chrono::milliseconds{10});
        }
        // This resets coroutine state.
        coroutine.Reset("composable");
        std::printf("\n");
    }
    return 0;
}